

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT8 __thiscall
VGMPlayer::GetSongDeviceInfo
          (VGMPlayer *this,vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *devInfList)

{
  ulong uVar1;
  long lVar2;
  size_type sVar3;
  SONG_DEV_CFG *pSVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  UINT32 local_8c;
  const_reference local_88;
  VGM_BASEDEV *clDev;
  PLR_DEV_INFO devInf;
  CHIP_DEVICE *cDev;
  DEV_GEN_CFG *dCfg;
  SONG_DEV_CFG *sdCfg;
  size_t curDev;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *devInfList_local;
  VGMPlayer *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::clear(devInfList);
    sVar3 = std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::size
                      (&this->_devCfgs);
    std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::reserve(devInfList,sVar3);
    sdCfg = (SONG_DEV_CFG *)0x0;
    while( true ) {
      pSVar4 = (SONG_DEV_CFG *)
               std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::size
                         (&this->_devCfgs);
      if (pSVar4 <= sdCfg) break;
      pvVar5 = std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::
               operator[](&this->_devCfgs,(size_type)sdCfg);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pvVar5->cfgData,0);
      uVar1 = pvVar5->deviceID;
      sVar3 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::size
                        (&this->_devices);
      if (uVar1 < sVar3) {
        local_88 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
                   operator[](&this->_devices,pvVar5->deviceID);
      }
      else {
        local_88 = (const_reference)0x0;
      }
      devInf.devCfg = (DEV_GEN_CFG *)local_88;
      memset(&clDev,0,0x18);
      clDev._4_1_ = pvVar5->type;
      clDev._0_4_ = (undefined4)pvVar5->deviceID;
      clDev._5_1_ = pvVar5->instance;
      devInf._8_8_ = pvVar6;
      if (devInf.devCfg == (DEV_GEN_CFG *)0x0) {
        devInf.id = 0;
        clDev._6_2_ = GetChipVolume(this,pvVar5->vgmChipType,pvVar5->instance,'\0');
        devInf.type = '\0';
        devInf.instance = '\0';
        devInf.volume = 0;
      }
      else {
        lVar2._0_4_ = devInf.devCfg[1].emuCore;
        lVar2._4_1_ = devInf.devCfg[1].srMode;
        lVar2._5_1_ = devInf.devCfg[1].flags;
        lVar2._6_2_ = *(undefined2 *)&devInf.devCfg[1].field_0x6;
        if (lVar2 == 0) {
          local_8c = 0;
        }
        else {
          local_8c = *(UINT32 *)(*(long *)(devInf.devCfg + 1) + 0x10);
        }
        devInf.id = local_8c;
        clDev._6_2_ = (UINT16)(((int)(short)devInf.devCfg[3].emuCore +
                               (int)*(short *)((long)&devInf.devCfg[3].emuCore + 2)) / 2);
        devInf._4_4_ = (devInf.devCfg)->clock;
      }
      std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::push_back
                (devInfList,(value_type *)&clDev);
      sdCfg = (SONG_DEV_CFG *)((long)&sdCfg->deviceID + 1);
    }
    if ((this->_playState & 1) == 0) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UINT8 VGMPlayer::GetSongDeviceInfo(std::vector<PLR_DEV_INFO>& devInfList) const
{
	if (_dLoad == NULL)
		return 0xFF;
	
	size_t curDev;
	
	devInfList.clear();
	devInfList.reserve(_devCfgs.size());
	for (curDev = 0; curDev < _devCfgs.size(); curDev ++)
	{
		const SONG_DEV_CFG& sdCfg = _devCfgs[curDev];
		const DEV_GEN_CFG* dCfg = (const DEV_GEN_CFG*)&sdCfg.cfgData[0];
		const CHIP_DEVICE* cDev = (sdCfg.deviceID < _devices.size()) ? &_devices[sdCfg.deviceID] : NULL;
		PLR_DEV_INFO devInf;
		
		// chip configuration from VGM header
		memset(&devInf, 0x00, sizeof(PLR_DEV_INFO));
		devInf.type = sdCfg.type;
		devInf.id = (UINT32)sdCfg.deviceID;
		devInf.instance = (UINT8)sdCfg.instance;
		devInf.devCfg = dCfg;
		if (cDev != NULL)
		{
			// when playing, get information from device structures (may feature modified volume levels)
			const VGM_BASEDEV* clDev = &cDev->base;
			devInf.core = (clDev->defInf.devDef != NULL) ? clDev->defInf.devDef->coreID : 0x00;
			devInf.volume = (clDev->resmpl.volumeL + clDev->resmpl.volumeR) / 2;
			devInf.smplRate = clDev->defInf.sampleRate;
		}
		else
		{
			devInf.core = 0x00;
			devInf.volume = GetChipVolume(sdCfg.vgmChipType, sdCfg.instance, 0);
			devInf.smplRate = 0;
		}
		devInfList.push_back(devInf);
	}
	if (_playState & PLAYSTATE_PLAY)
		return 0x01;	// returned "live" data
	else
		return 0x00;	// returned data based on file header
}